

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibLut.c
# Opt level: O3

int Abc_FrameSetLutLibrary(Abc_Frame_t *pAbc,char *pLutLibString)

{
  If_LibLut_t *pLib;
  If_LibLut_t *pLutLib;
  
  pLib = If_LibLutReadString(pLutLibString);
  if (pLib == (If_LibLut_t *)0x0) {
    fwrite("Reading LUT library from string has failed.\n",0x2c,1,_stdout);
  }
  else {
    pLutLib = (If_LibLut_t *)Abc_FrameReadLibLut();
    If_LibLutFree(pLutLib);
    Abc_FrameSetLibLut(pLib);
  }
  return (uint)(pLib != (If_LibLut_t *)0x0);
}

Assistant:

int Abc_FrameSetLutLibrary( Abc_Frame_t * pAbc, char * pLutLibString )
{
    If_LibLut_t * pLib = If_LibLutReadString( pLutLibString );
    if ( pLib == NULL )
    {
        fprintf( stdout, "Reading LUT library from string has failed.\n" );
        return 0;
    }
    // replace the current library
    If_LibLutFree( (If_LibLut_t *)Abc_FrameReadLibLut() );
    Abc_FrameSetLibLut( pLib );
    return 1;
}